

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O2

bool __thiscall Strings::QuotedDecoding::unquoteChar(QuotedDecoding *this,char **input,char *out)

{
  byte bVar1;
  char *pcVar2;
  char cVar3;
  byte bVar4;
  byte bVar5;
  char *pcVar6;
  
  pcVar2 = *input;
  do {
    while( true ) {
      pcVar6 = pcVar2;
      *input = pcVar6 + 1;
      cVar3 = *pcVar6;
      if (cVar3 != '=') goto LAB_0010d60d;
      *input = pcVar6 + 2;
      bVar4 = pcVar6[1];
      if (bVar4 != 0xd) break;
      *input = pcVar6 + 3;
      pcVar2 = pcVar6 + 3;
    }
    bVar5 = bVar4 - 0x30;
    if (bVar5 < 10) goto LAB_0010d5ce;
    pcVar2 = pcVar6 + 2;
  } while (bVar4 == 10);
  if ((0x25 < bVar4 - 0x41) || ((0x3f0000003fU >> ((ulong)(bVar4 - 0x41) & 0x3f) & 1) == 0)) {
    return false;
  }
  if (bVar4 < 0x47) {
    bVar5 = bVar4 - 0x37;
  }
  else {
    bVar5 = bVar4 + 0xa9;
  }
LAB_0010d5ce:
  *input = pcVar6 + 3;
  bVar1 = pcVar6[2];
  bVar4 = bVar1 - 0x30;
  if (9 < bVar4) {
    if (0x25 < bVar1 - 0x41) {
      return false;
    }
    if ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) == 0) {
      return false;
    }
    if (bVar1 < 0x47) {
      bVar4 = bVar1 - 0x37;
    }
    else {
      bVar4 = bVar1 + 0xa9;
    }
  }
  cVar3 = bVar5 * '\x10' + bVar4;
LAB_0010d60d:
  *out = cVar3;
  return true;
}

Assistant:

inline bool unquoteChar(const char * & input, char & out)
        {
	        int ch = *input++;
	        while (ch == '=')
	        {
		        ch = *input++;
		        // Filter CRLF
		        if (ch == '\r') ch = *input++;
#define IsHex(ch)	(ch >= '0' && ch <= '9') || (ch >= 'A' && ch <= 'F') || (ch >= 'a' && ch <= 'f')
		        else if (IsHex(ch))
		        {
		            int hexValue = ch <= '9' ? (ch - '0') : (ch <= 'F' ? ch - 'A' + 10 : ch - 'a' + 10);
			        ch = *input++;
			        if (IsHex(ch))
#undef IsHex
			        {
				        hexValue <<= 4;
				        hexValue += ch <= '9' ? (ch - '0') : (ch <= 'F' ? ch - 'A' + 10 : ch - 'a' + 10);
				        out = (char)hexValue;
				        return true;
			        }
                    return false;
		        }
		        else if (ch != '\n') return false;
		        ch = *input++;
	        }
	        out = (char)ch;
	        return true;
        }